

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O3

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int extraout_EAX;
  Reporter *siglen_00;
  undefined8 local_28;
  undefined8 local_20;
  
  ApprovalTests::Options::getNamer((Options *)sig);
  siglen_00 = ApprovalTests::Options::getReporter((Options *)sig);
  iVar1 = FileApprover::verify(local_28,(uchar *)ctx,(size_t)siglen_00,tbs,tbslen);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

static void verify(const ApprovalWriter& writer,
                           const Options& options = Options())
        {
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }